

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

void Gia_ManWriteMiniLut(Gia_Man_t *pGia,char *pFileName)

{
  Mini_Lut_t *p_00;
  Mini_Lut_t *p;
  char *pFileName_local;
  Gia_Man_t *pGia_local;
  
  p_00 = Gia_ManToMiniLut(pGia);
  Mini_LutDump(p_00,pFileName);
  Mini_LutStop(p_00);
  return;
}

Assistant:

void Gia_ManWriteMiniLut( Gia_Man_t * pGia, char * pFileName )
{
    Mini_Lut_t * p = Gia_ManToMiniLut( pGia );
    Mini_LutDump( p, pFileName );
    Mini_LutStop( p );
}